

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

void __thiscall pbrt::Transform::Transform(Transform *this,SquareMatrix<4> *m)

{
  bool bVar1;
  SquareMatrix<4> *__src;
  float *pfVar2;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  undefined1 auVar3 [64];
  span<float> sVar4;
  int j;
  int i;
  Float NaN;
  optional<pbrt::SquareMatrix<4>_> inv;
  SquareMatrix<4> *in_stack_00000828;
  float fVar5;
  SquareMatrix<4> *in_stack_ffffffffffffff50;
  span<float> local_80;
  int local_70;
  int local_6c;
  float local_68;
  optional local_54 [84];
  
  auVar3 = vmovdqu64_avx512f(*in_RSI);
  auVar3 = vmovdqu64_avx512f(auVar3);
  *in_RDI = auVar3;
  SquareMatrix<4>::SquareMatrix((SquareMatrix<4> *)(in_RDI + 1));
  Inverse<4>(in_stack_00000828);
  bVar1 = pstd::optional::operator_cast_to_bool(local_54);
  if (bVar1) {
    __src = pstd::optional<pbrt::SquareMatrix<4>_>::operator*
                      ((optional<pbrt::SquareMatrix<4>_> *)0x4544df);
    memcpy(in_RDI + 1,__src,0x40);
  }
  else {
    local_68 = std::numeric_limits<float>::signaling_NaN();
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
        fVar5 = local_68;
        sVar4 = SquareMatrix<4>::operator[](in_stack_ffffffffffffff50,(int)local_68);
        in_stack_ffffffffffffff50 = (SquareMatrix<4> *)sVar4.n;
        local_80 = sVar4;
        pfVar2 = pstd::span<float>::operator[](&local_80,(long)local_70);
        *pfVar2 = fVar5;
      }
    }
  }
  pstd::optional<pbrt::SquareMatrix<4>_>::~optional((optional<pbrt::SquareMatrix<4>_> *)0x4545cf);
  return;
}

Assistant:

PBRT_CPU_GPU
    Transform(const SquareMatrix<4> &m) : m(m) {
        pstd::optional<SquareMatrix<4>> inv = Inverse(m);
        if (inv)
            mInv = *inv;
        else {
            // Initialize _mInv_ with not-a-number values
            Float NaN = std::numeric_limits<Float>::has_signaling_NaN
                            ? std::numeric_limits<Float>::signaling_NaN()
                            : std::numeric_limits<Float>::quiet_NaN();
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j)
                    mInv[i][j] = NaN;
        }
    }